

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsessionmanager.cpp
# Opt level: O2

void sm_performSaveYourself(QXcbSessionManager *sm)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  __uid_t __uid;
  int iVar4;
  storage_type *psVar5;
  long lVar6;
  qsizetype asize;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QArrayDataPointer<char16_t> local_5d0;
  QArrayDataPointer<char16_t> local_5b8;
  QFileInfo fi;
  int value;
  QArrayDataPointer<QString> local_568;
  QByteArrayView local_548;
  passwd entry;
  passwd *entryPtr;
  QArrayDataPointer<char16_t> local_4f8;
  QArrayDataPointer<QString> local_4d8;
  timeval local_4b8;
  QStringBuilder<QString,_char16_t> local_4a8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_488;
  QVarLengthArray<char,_1024LL> buf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (sm_isshutdown) {
    qt_sm_blockUserInput = true;
  }
  local_4b8.tv_sec = -0x5555555555555556;
  local_4b8.tv_usec = -0x5555555555555556;
  gettimeofday(&local_4b8,(__timezone_ptr_t)0x0);
  QString::number((ulonglong)&local_4a8,(int)local_4b8.tv_sec);
  local_488.a.a.d.size = local_4a8.a.d.size;
  local_488.a.a.d.ptr = local_4a8.a.d.ptr;
  local_488.a.a.d.d = local_4a8.a.d.d;
  local_4a8.a.d.d = (Data *)0x0;
  local_4a8.a.d.ptr = (char16_t *)0x0;
  local_4a8.a.d.size = 0;
  local_488.a.b = L'_';
  QString::number((ulonglong)&local_4d8,(int)local_4b8.tv_usec);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&buf,&local_488.a,
             (QString *)&local_4d8);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
            ((QString *)&entry,(QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&buf);
  QString::operator=((QString *)&sm->field_0x20,(QString *)&entry);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&entry);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&buf);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_488);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
  local_4d8.size = -0x5555555555555556;
  local_4d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_4d8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  QCoreApplication::arguments();
  local_4f8.size = -0x5555555555555556;
  local_4f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_4f8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  if (local_4d8.size == 0) {
    QCoreApplication::applicationFilePath();
  }
  else {
    local_4f8.d = ((local_4d8.ptr)->d).d;
    local_4f8.ptr = ((local_4d8.ptr)->d).ptr;
    local_4f8.size = ((local_4d8.ptr)->d).size;
    if (local_4f8.d != (Data *)0x0) {
      LOCK();
      ((local_4f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_4f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("Program",8);
  QVar7.m_data = psVar5;
  QVar7.m_size = (qsizetype)&buf;
  QString::fromLatin1(QVar7);
  sm_setProperty((QString *)&buf,(QString *)&local_4f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&buf);
  entryPtr = (passwd *)0x0;
  memset(&buf,0xaa,0x418);
  lVar6 = sysconf(0x46);
  asize = 0x400;
  if (0x400 < lVar6) {
    asize = lVar6;
  }
  QVarLengthArray<char,_1024LL>::QVarLengthArray(&buf,asize);
  entry.pw_dir = (char *)0xaaaaaaaaaaaaaaaa;
  entry.pw_shell = (char *)0xaaaaaaaaaaaaaaaa;
  entry.pw_uid = 0xaaaaaaaa;
  entry.pw_gid = 0xaaaaaaaa;
  entry.pw_gecos = (char *)0xaaaaaaaaaaaaaaaa;
  entry.pw_name = (char *)0xaaaaaaaaaaaaaaaa;
  entry.pw_passwd = (char *)0xaaaaaaaaaaaaaaaa;
  while( true ) {
    __uid = geteuid();
    iVar4 = getpwuid_r(__uid,(passwd *)&entry,
                       (char *)buf.super_QVLABase<char>.super_QVLABaseBase.ptr,
                       buf.super_QVLABase<char>.super_QVLABaseBase.s,(passwd **)&entryPtr);
    if (iVar4 != 0x22) break;
    if (0x7fff < buf.super_QVLABase<char>.super_QVLABaseBase.s) {
      entry.pw_name = sm_performSaveYourself::badusername;
      entryPtr = &entry;
      goto LAB_00179c25;
    }
    QVarLengthArray<char,_1024LL>::resize(&buf,buf.super_QVLABase<char>.super_QVLABaseBase.s * 2);
  }
  if (entryPtr != (passwd *)0x0) {
LAB_00179c25:
    psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("UserID",7);
    QVar8.m_data = psVar5;
    QVar8.m_size = (qsizetype)&local_488;
    QString::fromLatin1(QVar8);
    QByteArrayView::QByteArrayView<char_*,_true>(&local_548,&entryPtr->pw_name);
    QVar9.m_data = (storage_type *)local_548.m_size;
    QVar9.m_size = (qsizetype)&local_4a8;
    QString::fromLocal8Bit(QVar9);
    sm_setProperty((QString *)&local_488,&local_4a8.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_488);
  }
  local_568.d = (Data *)0x0;
  local_568.ptr = (QString *)0x0;
  local_568.size = 0;
  QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_568,(QString *)&local_4f8);
  latin1.m_data = "-session";
  latin1.m_size = 8;
  QString::QString((QString *)&value,latin1);
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_568,(QString *)&value);
  (**(code **)(*(long *)sm + 0x10))(&local_5b8,sm);
  local_4a8.a.d.size = local_5b8.size;
  local_4a8.a.d.ptr = local_5b8.ptr;
  local_4a8.a.d.d = local_5b8.d;
  local_5b8.d = (Data *)0x0;
  local_5b8.ptr = (char16_t *)0x0;
  local_5b8.size = 0;
  local_4a8.b = L'_';
  (**(code **)(*(long *)sm + 0x18))(&local_5d0,sm);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
            (&local_488,&local_4a8,(QString *)&local_5d0);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
            ((QString *)&fi,&local_488);
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_568,(QString *)&fi);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fi);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_488);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_5d0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_5b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&value);
  _fi = (Data *)0xaaaaaaaaaaaaaaaa;
  QCoreApplication::applicationFilePath();
  QFileInfo::QFileInfo(&fi,(QString *)&local_488);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_488);
  qAppName();
  QFileInfo::fileName();
  iVar4 = QString::compare((QString *)&local_488,(CaseSensitivity)&local_4a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_488);
  if (iVar4 != 0) {
    latin1_00.m_data = "-name";
    latin1_00.m_size = 5;
    QString::QString((QString *)&local_488,latin1_00);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_568,(QString *)&local_488);
    qAppName();
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_568,&local_4a8.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_488);
  }
  (**(code **)(*(long *)sm + 0x50))(sm,&local_568);
  local_488.a.a.d.d = (Data *)0x0;
  local_488.a.a.d.ptr = (char16_t *)0x0;
  local_488.a.a.d.size = 0;
  (**(code **)(*(long *)sm + 0x60))(sm);
  if (sm_saveType == 0) {
    QPlatformSessionManager::appCommitData();
  }
  else if ((sm_saveType == 1) ||
          ((sm_saveType == 2 &&
           ((QPlatformSessionManager::appCommitData(), sm_isshutdown != true || (sm_cancel == 0)))))
          ) {
    QPlatformSessionManager::appSaveState();
  }
  if ((sm_phase2 == '\x01') && (sm_in_phase2 == '\0')) {
    SmcRequestSaveYourselfPhase2(smcConnection,sm_saveYourselfPhase2Callback,sm);
    qt_sm_blockUserInput = false;
    goto LAB_0017a060;
  }
  if (sm_interactionActive == '\x01') {
    bVar2 = sm_cancel & sm_isshutdown;
LAB_00179f07:
    SmcInteractDone(smcConnection,bVar2);
    sm_interactionActive = '\0';
  }
  else if (((sm_cancel == 1) && (sm_isshutdown == true)) &&
          (cVar3 = (**(code **)(*(long *)sm + 0x28))(), cVar3 != '\0')) {
    bVar2 = 1;
    goto LAB_00179f07;
  }
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("RestartCommand",0xf);
  QVar10.m_data = psVar5;
  QVar10.m_size = (qsizetype)&local_4a8;
  QString::fromLatin1(QVar10);
  (**(code **)(*(long *)sm + 0x58))((QArrayDataPointer<QString> *)&value,sm);
  sm_setProperty(&local_4a8.a,(QStringList *)&value);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&value);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
  psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("DiscardCommand",0xf);
  QVar11.m_data = psVar5;
  QVar11.m_size = (qsizetype)&local_4a8;
  QString::fromLatin1(QVar11);
  (**(code **)(*(long *)sm + 0x68))((QArrayDataPointer<QString> *)&value,sm);
  sm_setProperty(&local_4a8.a,(QStringList *)&value);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&value);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_4a8);
  local_4a8.a.d.d = (Data *)0xaaaaaaaa00000004;
  value = (**(code **)(*(long *)sm + 0x48))(sm);
  local_4a8.a.d.ptr = (char16_t *)&value;
  sm_setProperty("RestartStyleHint","CARD8",1,(SmPropValue *)&local_4a8);
  SmcSaveYourselfDone(smcConnection,sm_cancel ^ 1);
LAB_0017a060:
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_488);
  QFileInfo::~QFileInfo(&fi);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_568);
  QVarLengthArray<char,_1024LL>::~QVarLengthArray(&buf);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4f8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_4d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void sm_performSaveYourself(QXcbSessionManager *sm)
{
    if (sm_isshutdown)
        qt_sm_blockUserInput = true;

    // generate a new session key
    timeval tv;
    gettimeofday(&tv, nullptr);
    sm->setSessionKey(QString::number(qulonglong(tv.tv_sec)) +
                      u'_' +
                      QString::number(qulonglong(tv.tv_usec)));

    QStringList arguments = QCoreApplication::arguments();
    QString argument0 = arguments.isEmpty() ? QCoreApplication::applicationFilePath()
                                            : arguments.at(0);

    // tell the session manager about our program in best POSIX style
    sm_setProperty(QString::fromLatin1(SmProgram), argument0);
    // tell the session manager about our user as well.
    struct passwd *entryPtr = nullptr;
#if defined(_POSIX_THREAD_SAFE_FUNCTIONS) && (_POSIX_THREAD_SAFE_FUNCTIONS - 0 > 0)
    QVarLengthArray<char, 1024> buf(qMax<long>(sysconf(_SC_GETPW_R_SIZE_MAX), 1024L));
    struct passwd entry;
    while (getpwuid_r(geteuid(), &entry, buf.data(), buf.size(), &entryPtr) == ERANGE) {
        if (buf.size() >= 32768) {
            // too big already, fail
            static char badusername[] = "";
            entryPtr = &entry;
            entry.pw_name = badusername;
            break;
        }

        // retry with a bigger buffer
        buf.resize(buf.size() * 2);
    }
#else
    entryPtr = getpwuid(geteuid());
#endif
    if (entryPtr)
        sm_setProperty(QString::fromLatin1(SmUserID), QString::fromLocal8Bit(entryPtr->pw_name));

    // generate a restart and discard command that makes sense
    QStringList restart;
    restart << argument0 << "-session"_L1 << sm->sessionId() + u'_' + sm->sessionKey();

    QFileInfo fi(QCoreApplication::applicationFilePath());
    if (qAppName().compare(fi.fileName(), Qt::CaseInsensitive) != 0)
        restart << "-name"_L1 << qAppName();
    sm->setRestartCommand(restart);
    QStringList discard;
    sm->setDiscardCommand(discard);

    switch (sm_saveType) {
    case SmSaveBoth:
        sm->appCommitData();
        if (sm_isshutdown && sm_cancel)
            break; // we cancelled the shutdown, no need to save state
    Q_FALLTHROUGH();
    case SmSaveLocal:
        sm->appSaveState();
        break;
    case SmSaveGlobal:
        sm->appCommitData();
        break;
    default:
        break;
    }

    if (sm_phase2 && !sm_in_phase2) {
        SmcRequestSaveYourselfPhase2(smcConnection, sm_saveYourselfPhase2Callback, (SmPointer*) sm);
        qt_sm_blockUserInput = false;
    } else {
        // close eventual interaction monitors and cancel the
        // shutdown, if required. Note that we can only cancel when
        // performing a shutdown, it does not work for checkpoints
        if (sm_interactionActive) {
            SmcInteractDone(smcConnection, sm_isshutdown && sm_cancel);
            sm_interactionActive = false;
        } else if (sm_cancel && sm_isshutdown) {
            if (sm->allowsErrorInteraction()) {
                SmcInteractDone(smcConnection, True);
                sm_interactionActive = false;
            }
        }

        // set restart and discard command in session manager
        sm_setProperty(QString::fromLatin1(SmRestartCommand), sm->restartCommand());
        sm_setProperty(QString::fromLatin1(SmDiscardCommand), sm->discardCommand());

        // set the restart hint
        SmPropValue prop;
        prop.length = sizeof(int);
        int value = sm->restartHint();
        prop.value = (SmPointer) &value;
        sm_setProperty(SmRestartStyleHint, SmCARD8, 1, &prop);

        // we are done
        SmcSaveYourselfDone(smcConnection, !sm_cancel);
    }
}